

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               int ngcrse)

{
  int iVar1;
  double dVar2;
  uint ncomp;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var7;
  MultiFab *pMVar8;
  MultiFab *pMVar9;
  FabArray<amrex::FArrayBox> *this;
  double dVar10;
  int iVar11;
  bool bVar12;
  FabType FVar13;
  ulong uVar14;
  long lVar15;
  EBCellFlagFab *this_00;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  Periodicity *period;
  int iVar20;
  int *piVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  double *pdVar27;
  uint uVar28;
  long lVar29;
  double *pdVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  MFIter *pMVar35;
  FabArray<amrex::FArrayBox> *src;
  int idim;
  double *pdVar36;
  double dVar37;
  int local_6bc;
  long local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong local_678;
  long local_670;
  long local_668;
  int jj;
  undefined1 local_608 [24];
  long lStack_5f0;
  Dim3 local_5e8 [3];
  IntVect *local_5c0;
  Array<const_MultiFab_*,_3> *local_5b8;
  ulong local_5b0;
  int local_5a8;
  Box local_5a4;
  Box result;
  undefined4 uStack_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  Array4<const_double> local_508;
  undefined8 local_4c8 [3];
  MFIter mfi;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  _Var7._M_head_impl =
       (fine->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_5c0 = ratio;
  local_5b8 = fine;
  if (_Var7._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
    ncomp = (crse->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    uVar14 = (ulong)ncomp;
    lVar15 = __dynamic_cast(_Var7._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar15 != 0) {
      iVar3 = local_5c0->vect[0];
      iVar4 = local_5c0->vect[1];
      iVar5 = local_5c0->vect[2];
      lVar15 = __dynamic_cast(_Var7._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
      if (lVar15 == 0) {
        __cxa_bad_cast();
      }
      EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar15 + 0xd8));
      pMVar8 = local_5b8->_M_elems[0];
      pMVar9 = crse->_M_elems[0];
      bVar12 = DistributionMapping::operator==
                         (&(pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           distributionMap,
                          &(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           distributionMap);
      if ((bVar12) &&
         ((pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
        lVar15 = 0;
        do {
          MFIter::MFIter(&mfi,(FabArrayBase *)crse->_M_elems[lVar15],true);
          if (mfi.currentIndex < mfi.endIndex) {
            do {
              piVar21 = &mfi.currentIndex;
              if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar21 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + mfi.currentIndex;
              }
              this_00 = getEBCellFlagFab((local_5b8->_M_elems[lVar15]->
                                         super_FabArray<amrex::FArrayBox>).m_fabs_v.
                                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start[*piVar21]);
              MFIter::growntilebox(&local_5a4,&mfi,ngcrse);
              result.smallend.vect[1] = local_5a4.smallend.vect[1];
              result.smallend.vect[0] = local_5a4.smallend.vect[0];
              result.bigend.vect[0] = local_5a4.bigend.vect[0];
              result.smallend.vect[2] = local_5a4.smallend.vect[2];
              result.bigend.vect[2] = local_5a4.bigend.vect[2];
              result.bigend.vect[1] = local_5a4.bigend.vect[1];
              result.btype.itype = local_5a4.btype.itype;
              iVar23 = local_5c0->vect[0];
              iVar34 = local_5c0->vect[1];
              if (((iVar23 != 1) || (iVar34 != 1)) || (local_5c0->vect[2] != 1)) {
                result.smallend.vect[1] = local_5a4.smallend.vect[1] * iVar34;
                result.smallend.vect[0] = local_5a4.smallend.vect[0] * iVar23;
                uVar25 = (uint)((local_5a4.btype.itype & 2) == 0);
                uVar28 = (uint)((local_5a4.btype.itype & 4) == 0);
                result.bigend.vect[0] =
                     (local_5a4.bigend.vect[0] + (~local_5a4.btype.itype & 1)) * iVar23 -
                     (~local_5a4.btype.itype & 1);
                result.smallend.vect[2] = local_5a4.smallend.vect[2] * local_5c0->vect[2];
                result.bigend.vect[2] =
                     (local_5a4.bigend.vect[2] + uVar28) * local_5c0->vect[2] - uVar28;
                result.bigend.vect[1] = (local_5a4.bigend.vect[1] + uVar25) * iVar34 - uVar25;
              }
              FVar13 = EBCellFlagFab::getType(this_00,&result);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)&result,
                         &crse->_M_elems[lVar15]->super_FabArray<amrex::FArrayBox>,&mfi);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)local_608,
                         &local_5b8->_M_elems[lVar15]->super_FabArray<amrex::FArrayBox>,&mfi);
              iVar23 = (int)lVar15;
              if ((uint)(FVar13 + singlevalued) < 2) {
                lVar16 = (long)local_5a4.smallend.vect[0];
                lVar17 = (long)local_5a4.smallend.vect[1];
                uVar25 = local_5c0->vect[0];
                uVar28 = local_5c0->vect[1];
                uVar6 = local_5c0->vect[2];
                if (iVar23 == 0) {
                  if (0 < (int)ncomp) {
                    local_678 = 0;
                    do {
                      local_6b8 = (long)local_5a4.smallend.vect[2];
                      if (local_5a4.smallend.vect[2] <= local_5a4.bigend.vect[2]) {
                        do {
                          if (local_5a4.smallend.vect[1] <= local_5a4.bigend.vect[1]) {
                            local_668 = lVar17;
                            iVar23 = local_5a4.smallend.vect[1] * uVar28;
                            do {
                              if (local_5a4.smallend.vect[0] <= local_5a4.bigend.vect[0]) {
                                lVar29 = lVar16;
                                do {
                                  if ((int)uVar6 < 1) {
                                    dVar37 = 0.0;
                                  }
                                  else {
                                    dVar37 = 0.0;
                                    uVar24 = 0;
                                    do {
                                      if (0 < (int)uVar28) {
                                        uVar26 = (ulong)uVar28;
                                        iVar34 = iVar23 - local_5e8[0].y;
                                        do {
                                          dVar37 = dVar37 + *(double *)
                                                             (local_608._0_8_ +
                                                             ((lVar29 * (int)uVar25 -
                                                              (long)local_5e8[0].x) +
                                                             lStack_5f0 * local_678 +
                                                             (long)(int)(((int)uVar24 +
                                                                         (int)local_6b8 * uVar6) -
                                                                        local_5e8[0].z) *
                                                             local_608._16_8_ +
                                                             local_608._8_8_ * (long)iVar34) * 8);
                                          iVar34 = iVar34 + 1;
                                          uVar26 = uVar26 - 1;
                                        } while (uVar26 != 0);
                                      }
                                      uVar24 = uVar24 + 1;
                                    } while (uVar24 != uVar6);
                                  }
                                  *(double *)
                                   ((local_6b8 - (int)local_560) * result.bigend.vect._4_8_ * 8 +
                                    result.smallend.vect._0_8_ +
                                    CONCAT44(uStack_56c,result.btype.itype) * local_678 * 8 +
                                    (local_668 - (int)local_564) * result._8_8_ * 8 +
                                   (lVar29 - (int)local_568) * 8) =
                                       dVar37 * (1.0 / (double)(int)(uVar6 * uVar28));
                                  lVar29 = lVar29 + 1;
                                } while (local_5a4.bigend.vect[0] + 1 != (int)lVar29);
                              }
                              local_668 = local_668 + 1;
                              iVar23 = iVar23 + uVar28;
                            } while (local_5a4.bigend.vect[1] + 1U != (int)local_668);
                          }
                          local_6b8 = local_6b8 + 1;
                        } while (local_5a4.bigend.vect[2] + 1 != (int)local_6b8);
                      }
                      local_678 = local_678 + 1;
                    } while (local_678 != uVar14);
                  }
                }
                else if (iVar23 == 1) {
                  if (0 < (int)ncomp) {
                    local_6a8 = 0;
                    do {
                      local_6b8 = (long)local_5a4.smallend.vect[2];
                      if (local_5a4.smallend.vect[2] <= local_5a4.bigend.vect[2]) {
                        do {
                          if (local_5a4.smallend.vect[1] <= local_5a4.bigend.vect[1]) {
                            local_678 = lVar17;
                            do {
                              if (local_5a4.smallend.vect[0] <= local_5a4.bigend.vect[0]) {
                                lVar29 = lVar16;
                                iVar23 = local_5a4.smallend.vect[0] * uVar25;
                                do {
                                  if ((int)uVar6 < 1) {
                                    dVar37 = 0.0;
                                  }
                                  else {
                                    dVar37 = 0.0;
                                    uVar24 = 0;
                                    do {
                                      if (0 < (int)uVar25) {
                                        uVar26 = (ulong)uVar25;
                                        iVar34 = iVar23 - local_5e8[0].x;
                                        do {
                                          dVar37 = dVar37 + *(double *)
                                                             (local_608._0_8_ +
                                                             ((local_678 * (long)(int)uVar28 -
                                                              (long)local_5e8[0].y) *
                                                              local_608._8_8_ +
                                                             lStack_5f0 * local_6a8 +
                                                             (long)(int)(((int)local_6b8 * uVar6 +
                                                                         (int)uVar24) -
                                                                        local_5e8[0].z) *
                                                             local_608._16_8_ + (long)iVar34) * 8);
                                          iVar34 = iVar34 + 1;
                                          uVar26 = uVar26 - 1;
                                        } while (uVar26 != 0);
                                      }
                                      uVar24 = uVar24 + 1;
                                    } while (uVar24 != uVar6);
                                  }
                                  *(double *)
                                   ((local_6b8 - (int)local_560) * result.bigend.vect._4_8_ * 8 +
                                    result.smallend.vect._0_8_ +
                                    CONCAT44(uStack_56c,result.btype.itype) * local_6a8 * 8 +
                                    (local_678 - (long)(int)local_564) * result._8_8_ * 8 +
                                   (lVar29 - (int)local_568) * 8) =
                                       dVar37 * (1.0 / (double)(int)(uVar6 * uVar25));
                                  lVar29 = lVar29 + 1;
                                  iVar23 = iVar23 + uVar25;
                                } while (local_5a4.bigend.vect[0] + 1 != (int)lVar29);
                              }
                              local_678 = local_678 + 1;
                            } while (local_5a4.bigend.vect[1] + 1U != (int)local_678);
                          }
                          local_6b8 = local_6b8 + 1;
                        } while (local_5a4.bigend.vect[2] + 1 != (int)local_6b8);
                      }
                      local_6a8 = local_6a8 + 1;
                    } while (local_6a8 != uVar14);
                  }
                }
                else if ((iVar23 == 2) && (0 < (int)ncomp)) {
                  local_6a8 = 0;
                  do {
                    iVar23 = local_5a4.smallend.vect[2];
                    if (local_5a4.smallend.vect[2] <= local_5a4.bigend.vect[2]) {
                      do {
                        if (local_5a4.smallend.vect[1] <= local_5a4.bigend.vect[1]) {
                          local_668 = lVar17;
                          do {
                            if (local_5a4.smallend.vect[0] <= local_5a4.bigend.vect[0]) {
                              lVar29 = lVar16;
                              iVar34 = uVar25 * local_5a4.smallend.vect[0];
                              do {
                                if ((int)uVar28 < 1) {
                                  dVar37 = 0.0;
                                }
                                else {
                                  dVar37 = 0.0;
                                  uVar24 = 0;
                                  do {
                                    if (0 < (int)uVar25) {
                                      uVar26 = (ulong)uVar25;
                                      iVar31 = iVar34 - local_5e8[0].x;
                                      do {
                                        dVar37 = dVar37 + *(double *)
                                                           (local_608._0_8_ +
                                                           (((long)(int)(iVar23 * uVar6) -
                                                            (long)local_5e8[0].z) * local_608._16_8_
                                                           + lStack_5f0 * local_6a8 +
                                                             (long)(int)(((int)local_668 * uVar28 +
                                                                         (int)uVar24) -
                                                                        local_5e8[0].y) *
                                                             local_608._8_8_ + (long)iVar31) * 8);
                                        iVar31 = iVar31 + 1;
                                        uVar26 = uVar26 - 1;
                                      } while (uVar26 != 0);
                                    }
                                    uVar24 = uVar24 + 1;
                                  } while (uVar24 != uVar28);
                                }
                                *(double *)
                                 (((long)iVar23 - (long)(int)local_560) * result.bigend.vect._4_8_ *
                                  8 + result.smallend.vect._0_8_ +
                                  CONCAT44(uStack_56c,result.btype.itype) * local_6a8 * 8 +
                                  (local_668 - (int)local_564) * result._8_8_ * 8 +
                                 (lVar29 - (int)local_568) * 8) =
                                     dVar37 * (1.0 / (double)(int)(uVar28 * uVar25));
                                lVar29 = lVar29 + 1;
                                iVar34 = iVar34 + uVar25;
                              } while (local_5a4.bigend.vect[0] + 1 != (int)lVar29);
                            }
                            local_668 = local_668 + 1;
                          } while (local_5a4.bigend.vect[1] + 1U != (int)local_668);
                        }
                        bVar12 = iVar23 != local_5a4.bigend.vect[2];
                        iVar23 = iVar23 + 1;
                      } while (bVar12);
                    }
                    local_6a8 = local_6a8 + 1;
                  } while (local_6a8 != uVar14);
                }
              }
              else {
                MultiCutFab::const_array(&local_508,(MultiCutFab *)local_4c8[lVar15],&mfi);
                if (iVar23 == 1) {
                  if (local_5a4.smallend.vect[2] <= local_5a4.bigend.vect[2]) {
                    iVar34 = iVar5 * local_5a4.smallend.vect[2];
                    iVar31 = (local_5a4.smallend.vect[2] + 1) * iVar5;
                    local_5b0 = CONCAT44(local_5b0._4_4_,local_5a4.smallend.vect[1]);
                    local_5a8 = iVar4 * local_5a4.smallend.vect[1];
                    iVar23 = local_5a4.smallend.vect[2];
                    do {
                      lVar16 = (long)iVar34;
                      if (local_5a4.smallend.vect[1] <= local_5a4.bigend.vect[1]) {
                        local_6bc = local_5a8;
                        uVar25 = local_5a4.smallend.vect[1];
                        do {
                          if (local_5a4.smallend.vect[0] <= local_5a4.bigend.vect[0]) {
                            iVar20 = iVar3 * local_5a4.smallend.vect[0];
                            iVar1 = local_5a4.smallend.vect[0];
                            do {
                              if (0 < (int)ncomp) {
                                lVar17 = 0;
                                uVar24 = 0;
                                do {
                                  dVar37 = 0.0;
                                  dVar10 = 0.0;
                                  if (iVar23 * iVar5 < (iVar23 + 1) * iVar5) {
                                    lVar22 = (long)local_508.p +
                                             (lVar16 - local_508.begin.z) * local_508.kstride * 8 +
                                             ((long)local_6bc - (long)local_508.begin.y) *
                                             local_508.jstride * 8 + (long)local_508.begin.x * -8 +
                                             (long)iVar20 * 8;
                                    lVar19 = local_608._0_8_ +
                                             lStack_5f0 * lVar17 +
                                             (lVar16 - local_5e8[0].z) * local_608._16_8_ * 8 +
                                             ((long)local_6bc - (long)local_5e8[0].y) *
                                             local_608._8_8_ * 8 + (long)local_5e8[0].x * -8 +
                                             (long)iVar20 * 8;
                                    lVar29 = lVar16;
                                    dVar10 = 0.0;
                                    do {
                                      if (iVar1 * iVar3 < (iVar1 + 1) * iVar3) {
                                        lVar33 = 0;
                                        do {
                                          dVar2 = *(double *)(lVar22 + lVar33 * 8);
                                          dVar37 = dVar37 + *(double *)(lVar19 + lVar33 * 8) * dVar2
                                          ;
                                          dVar10 = dVar10 + dVar2;
                                          lVar33 = lVar33 + 1;
                                        } while (iVar3 != (int)lVar33);
                                      }
                                      lVar29 = lVar29 + 1;
                                      lVar22 = lVar22 + local_508.kstride * 8;
                                      lVar19 = lVar19 + local_608._16_8_ * 8;
                                    } while (iVar31 != (int)lVar29);
                                  }
                                  if (dVar10 <= 1e-30) {
                                    dVar37 = *(double *)
                                              (local_608._0_8_ +
                                              (((long)(int)(uVar25 * iVar4) - (long)local_5e8[0].y)
                                               * local_608._8_8_ +
                                              ((long)(iVar1 * iVar3) - (long)local_5e8[0].x) +
                                              ((long)(iVar23 * iVar5) - (long)local_5e8[0].z) *
                                              local_608._16_8_ + lStack_5f0 * uVar24) * 8);
                                  }
                                  else {
                                    dVar37 = dVar37 / dVar10;
                                  }
                                  *(double *)
                                   (((long)(int)uVar25 - (long)(int)local_564) * result._8_8_ * 8 +
                                    result.smallend.vect._0_8_ +
                                    ((long)iVar1 - (long)(int)local_568) * 8 +
                                    ((long)iVar23 - (long)(int)local_560) * result.bigend.vect._4_8_
                                    * 8 + CONCAT44(uStack_56c,result.btype.itype) * uVar24 * 8) =
                                       dVar37;
                                  uVar24 = uVar24 + 1;
                                  lVar17 = lVar17 + 8;
                                } while (uVar24 != uVar14);
                              }
                              iVar20 = iVar20 + iVar3;
                              bVar12 = iVar1 != local_5a4.bigend.vect[0];
                              iVar1 = iVar1 + 1;
                            } while (bVar12);
                          }
                          local_6bc = local_6bc + iVar4;
                          bVar12 = uVar25 != local_5a4.bigend.vect[1];
                          uVar25 = uVar25 + 1;
                        } while (bVar12);
                      }
                      iVar34 = iVar34 + iVar5;
                      iVar31 = iVar31 + iVar5;
                      bVar12 = iVar23 != local_5a4.bigend.vect[2];
                      iVar23 = iVar23 + 1;
                    } while (bVar12);
                  }
                }
                else if (iVar23 == 0) {
                  local_5b0 = CONCAT44(local_5b0._4_4_,local_5a4.bigend.vect[2]);
                  if (local_5a4.smallend.vect[2] <= local_5a4.bigend.vect[2]) {
                    iVar34 = iVar5 * local_5a4.smallend.vect[2];
                    iVar31 = (local_5a4.smallend.vect[2] + 1) * iVar5;
                    iVar23 = local_5a4.smallend.vect[2];
                    do {
                      lVar16 = (long)iVar34;
                      if (local_5a4.smallend.vect[1] <= local_5a4.bigend.vect[1]) {
                        iVar20 = iVar4 * local_5a4.smallend.vect[1];
                        uVar25 = local_5a4.smallend.vect[1];
                        do {
                          if (local_5a4.smallend.vect[0] <= local_5a4.bigend.vect[0]) {
                            iVar1 = iVar3 * local_5a4.smallend.vect[0];
                            iVar11 = local_5a4.smallend.vect[0];
                            do {
                              if (0 < (int)ncomp) {
                                local_670 = 0;
                                uVar24 = 0;
                                do {
                                  dVar37 = 0.0;
                                  dVar10 = 0.0;
                                  if (iVar23 * iVar5 < (iVar23 + 1) * iVar5) {
                                    pdVar36 = (double *)
                                              ((long)local_508.p +
                                              ((long)iVar20 - (long)local_508.begin.y) *
                                              local_508.jstride * 8 +
                                              (lVar16 - local_508.begin.z) * local_508.kstride * 8 +
                                              (long)local_508.begin.x * -8 + (long)iVar1 * 8);
                                    pdVar18 = (double *)
                                              (local_608._0_8_ +
                                              lStack_5f0 * local_670 +
                                              ((long)iVar20 - (long)local_5e8[0].y) *
                                              local_608._8_8_ * 8 +
                                              (lVar16 - local_5e8[0].z) * local_608._16_8_ * 8 +
                                              (long)local_5e8[0].x * -8 + (long)iVar1 * 8);
                                    lVar17 = lVar16;
                                    dVar10 = 0.0;
                                    do {
                                      pdVar27 = pdVar36;
                                      pdVar30 = pdVar18;
                                      iVar32 = iVar4;
                                      if ((int)(uVar25 * iVar4) < (int)((uVar25 + 1) * iVar4)) {
                                        do {
                                          dVar37 = dVar37 + *pdVar30 * *pdVar27;
                                          dVar10 = dVar10 + *pdVar27;
                                          pdVar27 = pdVar27 + local_508.jstride;
                                          pdVar30 = pdVar30 + local_608._8_8_;
                                          iVar32 = iVar32 + -1;
                                        } while (iVar32 != 0);
                                      }
                                      lVar17 = lVar17 + 1;
                                      pdVar36 = pdVar36 + local_508.kstride;
                                      pdVar18 = pdVar18 + local_608._16_8_;
                                    } while (iVar31 != (int)lVar17);
                                  }
                                  if (dVar10 <= 1e-30) {
                                    dVar37 = *(double *)
                                              (local_608._0_8_ +
                                              (((long)(int)(uVar25 * iVar4) - (long)local_5e8[0].y)
                                               * local_608._8_8_ +
                                              ((long)(iVar11 * iVar3) - (long)local_5e8[0].x) +
                                              ((long)(iVar23 * iVar5) - (long)local_5e8[0].z) *
                                              local_608._16_8_ + lStack_5f0 * uVar24) * 8);
                                  }
                                  else {
                                    dVar37 = dVar37 / dVar10;
                                  }
                                  *(double *)
                                   (((long)(int)uVar25 - (long)(int)local_564) * result._8_8_ * 8 +
                                    result.smallend.vect._0_8_ +
                                    ((long)iVar11 - (long)(int)local_568) * 8 +
                                    ((long)iVar23 - (long)(int)local_560) * result.bigend.vect._4_8_
                                    * 8 + CONCAT44(uStack_56c,result.btype.itype) * uVar24 * 8) =
                                       dVar37;
                                  uVar24 = uVar24 + 1;
                                  local_670 = local_670 + 8;
                                } while (uVar24 != uVar14);
                              }
                              iVar1 = iVar1 + iVar3;
                              bVar12 = iVar11 != local_5a4.bigend.vect[0];
                              iVar11 = iVar11 + 1;
                            } while (bVar12);
                          }
                          iVar20 = iVar20 + iVar4;
                          bVar12 = uVar25 != local_5a4.bigend.vect[1];
                          uVar25 = uVar25 + 1;
                        } while (bVar12);
                      }
                      iVar34 = iVar34 + iVar5;
                      iVar31 = iVar31 + iVar5;
                      bVar12 = iVar23 != local_5a4.bigend.vect[2];
                      iVar23 = iVar23 + 1;
                    } while (bVar12);
                  }
                }
                else if (local_5a4.smallend.vect[2] <= local_5a4.bigend.vect[2]) {
                  local_5b0 = (ulong)(uint)local_5a4.smallend.vect[1];
                  local_5a8 = iVar4 * local_5a4.smallend.vect[1];
                  iVar34 = iVar5 * local_5a4.smallend.vect[2];
                  iVar23 = local_5a4.smallend.vect[2];
                  do {
                    if (local_5a4.smallend.vect[1] <= local_5a4.bigend.vect[1]) {
                      iVar31 = local_5a8;
                      local_6b0 = local_5b0;
                      iVar20 = (local_5a4.smallend.vect[1] + 1U) * iVar4;
                      do {
                        lVar16 = (long)iVar31;
                        uVar25 = (uint)local_6b0;
                        if (local_5a4.smallend.vect[0] <= local_5a4.bigend.vect[0]) {
                          iVar1 = iVar3 * local_5a4.smallend.vect[0];
                          iVar11 = local_5a4.smallend.vect[0];
                          do {
                            if (0 < (int)ncomp) {
                              lVar17 = 0;
                              uVar24 = 0;
                              do {
                                dVar37 = 0.0;
                                dVar10 = 0.0;
                                if ((int)(uVar25 * iVar4) < (int)((uVar25 + 1) * iVar4)) {
                                  lVar22 = (long)local_508.p +
                                           (lVar16 - local_508.begin.y) * local_508.jstride * 8 +
                                           ((long)iVar34 - (long)local_508.begin.z) *
                                           local_508.kstride * 8 + (long)local_508.begin.x * -8 +
                                           (long)iVar1 * 8;
                                  lVar19 = local_608._0_8_ +
                                           lStack_5f0 * lVar17 +
                                           (lVar16 - local_5e8[0].y) * local_608._8_8_ * 8 +
                                           ((long)iVar34 - (long)local_5e8[0].z) * local_608._16_8_
                                           * 8 + (long)local_5e8[0].x * -8 + (long)iVar1 * 8;
                                  lVar29 = lVar16;
                                  dVar10 = 0.0;
                                  do {
                                    if (iVar11 * iVar3 < (iVar11 + 1) * iVar3) {
                                      lVar33 = 0;
                                      do {
                                        dVar2 = *(double *)(lVar22 + lVar33 * 8);
                                        dVar37 = dVar37 + *(double *)(lVar19 + lVar33 * 8) * dVar2;
                                        dVar10 = dVar10 + dVar2;
                                        lVar33 = lVar33 + 1;
                                      } while (iVar3 != (int)lVar33);
                                    }
                                    lVar29 = lVar29 + 1;
                                    lVar22 = lVar22 + local_508.jstride * 8;
                                    lVar19 = lVar19 + local_608._8_8_ * 8;
                                  } while (iVar20 != (int)lVar29);
                                }
                                if (dVar10 <= 1e-30) {
                                  dVar37 = *(double *)
                                            (local_608._0_8_ +
                                            (((long)(int)(uVar25 * iVar4) - (long)local_5e8[0].y) *
                                             local_608._8_8_ +
                                            ((long)(iVar11 * iVar3) - (long)local_5e8[0].x) +
                                            ((long)(iVar23 * iVar5) - (long)local_5e8[0].z) *
                                            local_608._16_8_ + lStack_5f0 * uVar24) * 8);
                                }
                                else {
                                  dVar37 = dVar37 / dVar10;
                                }
                                *(double *)
                                 (((long)(int)uVar25 - (long)(int)local_564) * result._8_8_ * 8 +
                                  result.smallend.vect._0_8_ +
                                  ((long)iVar11 - (long)(int)local_568) * 8 +
                                  ((long)iVar23 - (long)(int)local_560) * result.bigend.vect._4_8_ *
                                  8 + CONCAT44(uStack_56c,result.btype.itype) * uVar24 * 8) = dVar37
                                ;
                                uVar24 = uVar24 + 1;
                                lVar17 = lVar17 + 8;
                              } while (uVar24 != uVar14);
                            }
                            iVar1 = iVar1 + iVar3;
                            bVar12 = iVar11 != local_5a4.bigend.vect[0];
                            iVar11 = iVar11 + 1;
                          } while (bVar12);
                        }
                        local_6b0 = (ulong)(uVar25 + 1);
                        iVar31 = iVar31 + iVar4;
                        iVar20 = iVar20 + iVar4;
                      } while (uVar25 != local_5a4.bigend.vect[1]);
                    }
                    iVar34 = iVar34 + iVar5;
                    bVar12 = iVar23 != local_5a4.bigend.vect[2];
                    iVar23 = iVar23 + 1;
                  } while (bVar12);
                }
              }
              MFIter::operator++(&mfi);
            } while (mfi.currentIndex < mfi.endIndex);
          }
          MFIter::~MFIter(&mfi);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
      }
      else {
        lVar15 = 0;
        do {
          MultiFab::MultiFab((MultiFab *)((long)mfi.tile_size.vect + lVar15 + -0x10));
          lVar15 = lVar15 + 0x180;
        } while (lVar15 != 0x480);
        pMVar35 = &mfi;
        lVar15 = 0;
        do {
          BoxArray::BoxArray((BoxArray *)&result,
                             &(local_5b8->_M_elems[lVar15]->super_FabArray<amrex::FArrayBox>).
                              super_FabArrayBase.boxarray);
          BoxArray::coarsen((BoxArray *)&result,local_5c0);
          local_608._0_8_ = (double *)0x1;
          lStack_5f0 = 0;
          local_5e8[0].x = 0;
          local_5e8[0].y = 0;
          local_608._8_8_ = 0;
          local_608._16_8_ = 0;
          local_508.p = (double *)&PTR__FabFactory_008378d0;
          (**(code **)((long)&((pMVar35->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                              boxarray + 8))
                    (pMVar35,(BoxArray *)&result,
                     &(local_5b8->_M_elems[lVar15]->super_FabArray<amrex::FArrayBox>).
                      super_FabArrayBase.distributionMap,uVar14,ngcrse,local_608,&local_508);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_608 + 0x10));
          BoxArray::~BoxArray((BoxArray *)&result);
          lVar15 = lVar15 + 1;
          pMVar35 = pMVar35 + 4;
        } while (lVar15 != 3);
        src = (FabArray<amrex::FArrayBox> *)&mfi;
        result._8_8_ = local_330;
        result.bigend.vect._4_8_ = local_1b0;
        result.smallend.vect._0_8_ = src;
        EB_average_down_faces(local_5b8,(Array<MultiFab_*,_3> *)&result,local_5c0,ngcrse);
        lVar15 = 0;
        do {
          this = &crse->_M_elems[lVar15]->super_FabArray<amrex::FArrayBox>;
          period = Periodicity::NonPeriodic();
          result.smallend.vect[1] = ngcrse;
          result.smallend.vect[0] = ngcrse;
          result.smallend.vect[2] = ngcrse;
          local_608._4_4_ = ngcrse;
          local_608._0_4_ = ngcrse;
          local_608._8_4_ = ngcrse;
          FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                    (this,src,0,0,ncomp,&result.smallend,(IntVect *)local_608,period,COPY,(CPC *)0x0
                     ,false);
          lVar15 = lVar15 + 1;
          src = src + 1;
        } while (lVar15 != 3);
        lVar15 = 0x300;
        do {
          MultiFab::~MultiFab((MultiFab *)((long)mfi.tile_size.vect + lVar15 + -0x10));
          lVar15 = lVar15 + -0x180;
        } while (lVar15 != -0x180);
      }
      return;
    }
  }
  average_down_faces(local_5b8,crse,local_5c0,ngcrse);
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, int ngcrse)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    int ncomp = crse[0]->nComp();
    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>((*fine[0]).Factory());
        const auto&  aspect = factory.getAreaFrac();

        if (isMFIterSafe(*fine[0], *crse[0]))
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (int n=0; n<AMREX_SPACEDIM; ++n) {
                for (MFIter mfi(*crse[n],TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const auto& flag_fab = amrex::getEBCellFlagFab((*fine[n])[mfi]);
                    const Box& tbx = mfi.growntilebox(ngcrse);
                    FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

                    Array4<Real> const& ca = crse[n]->array(mfi);
                    Array4<Real const> const& fa = fine[n]->const_array(mfi);

                    if(typ == FabType::regular || typ == FabType::covered)
                    {
                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA(tbx, b,
                        {
                            amrex_avgdown_faces(b, ca, fa, 0, 0, ncomp, ratio, n);
                        });
                    }
                    else
                    {
                        Array4<Real const> const& ap = aspect[n]->const_array(mfi);
                        if (n == 0) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_x(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else if (n == 1) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_y(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else {
#if (AMREX_SPACEDIM == 3)
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_z(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
#endif
                        }
                    }
                }
            }
        }
        else
        {
            Array<MultiFab,AMREX_SPACEDIM> ctmp;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                BoxArray cba = fine[idim]->boxArray();
                cba.coarsen(ratio);
                ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            }
            EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,ngcrse,ngcrse);
            }
        }
    }
}